

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVCVTQ(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  DecodeStatus DVar7;
  MCInst *in_RCX;
  undefined8 in_RDX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint Vd;
  uint op;
  uint cmode;
  uint imm;
  uint Vm;
  DecodeStatus S;
  uint Insn_00;
  undefined4 in_stack_ffffffffffffffe8;
  DecodeStatus local_4;
  
  Insn_00 = (uint)((ulong)in_RDX >> 0x20);
  local_4 = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,0xc,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0x16,1);
  uVar4 = uVar3 << 4 | uVar2;
  uVar2 = fieldFromInstruction_4(in_ESI,0,4);
  uVar3 = fieldFromInstruction_4(in_ESI,5,1);
  uVar5 = uVar3 << 4 | uVar2;
  uVar2 = fieldFromInstruction_4(in_ESI,0x10,6);
  uVar3 = fieldFromInstruction_4(in_ESI,8,4);
  uVar6 = fieldFromInstruction_4(in_ESI,5,1);
  if (((uVar2 & 0x38) == 0) && (uVar3 == 0xf)) {
    if (uVar6 == 1) {
      local_4 = MCDisassembler_Fail;
    }
    else {
      MCInst_setOpcode(in_RDI,0x560);
      local_4 = DecodeNEONModImmInstruction
                          ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),Insn_00,
                           (uint64_t)in_RCX,(void *)CONCAT44(local_4,uVar5));
    }
  }
  else if ((uVar2 & 0x20) == 0) {
    local_4 = MCDisassembler_Fail;
  }
  else {
    DVar7 = DecodeQPRRegisterClass
                      (in_RCX,local_4,CONCAT44(uVar2,uVar3),(void *)CONCAT44(uVar6,uVar4));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar7);
    if (_Var1) {
      DVar7 = DecodeQPRRegisterClass
                        (in_RCX,local_4,CONCAT44(uVar2,uVar3),(void *)CONCAT44(uVar6,uVar4));
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar7);
      if (_Var1) {
        MCOperand_CreateImm0(in_RDI,(ulong)(0x40 - uVar2));
      }
      else {
        local_4 = MCDisassembler_Fail;
      }
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeVCVTQ(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Vm, imm, cmode, op;
	unsigned Vd = (fieldFromInstruction_4(Insn, 12, 4) << 0);
	Vd |= (fieldFromInstruction_4(Insn, 22, 1) << 4);
	Vm = (fieldFromInstruction_4(Insn, 0, 4) << 0);
	Vm |= (fieldFromInstruction_4(Insn, 5, 1) << 4);
	imm = fieldFromInstruction_4(Insn, 16, 6);
	cmode = fieldFromInstruction_4(Insn, 8, 4);
	op = fieldFromInstruction_4(Insn, 5, 1);

	// VMOVv4f32 is ambiguous with these decodings.
	if (!(imm & 0x38) && cmode == 0xF) {
		if (op == 1) return MCDisassembler_Fail;
		MCInst_setOpcode(Inst, ARM_VMOVv4f32);
		return DecodeNEONModImmInstruction(Inst, Insn, Address, Decoder);
	}

	if (!(imm & 0x20)) return MCDisassembler_Fail;

	if (!Check(&S, DecodeQPRRegisterClass(Inst, Vd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeQPRRegisterClass(Inst, Vm, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, 64 - imm);

	return S;
}